

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_option_xattrs.c
# Opt level: O1

void test_option_xattrs(void)

{
  wchar_t wVar1;
  void *pvVar2;
  size_t size;
  size_t local_38;
  
  assertion_make_file("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/tar/test/test_option_xattrs.c"
                      ,L'\x16',"f",L'Ƥ',L'\xffffffff',"a");
  wVar1 = setXattr("f","user.libarchive.test","testval",8);
  if (wVar1 != L'\0') {
    wVar1 = systemf("%s -c --no-mac-metadata --xattrs -f xattrs.tar f >xattrs.out 2>xattrs.err",
                    testprog);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/tar/test/test_option_xattrs.c"
                        ,L'!',(long)wVar1,"r",0,"0",(void *)0x0);
    wVar1 = systemf("%s -c --no-mac-metadata --no-xattrs -f noxattrs.tar f >noxattrs.out 2>noxattrs.err"
                    ,testprog);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/tar/test/test_option_xattrs.c"
                        ,L'%',(long)wVar1,"r",0,"0",(void *)0x0);
    assertion_make_dir("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/tar/test/test_option_xattrs.c"
                       ,L'(',"xattrs_xattrs",L'ǭ');
    wVar1 = systemf("%s -x -C xattrs_xattrs --no-same-permissions --xattrs -f xattrs.tar >xattrs_xattrs.out 2>xattrs_xattrs.err"
                    ,testprog);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/tar/test/test_option_xattrs.c"
                        ,L'*',(long)wVar1,"r",0,"0",(void *)0x0);
    pvVar2 = getXattr("xattrs_xattrs/f","user.libarchive.test",&local_38);
    wVar1 = assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/tar/test/test_option_xattrs.c"
                                ,L',',local_38,"size",8,"strlen(testval) + 1",(void *)0x0);
    if (wVar1 != L'\0') {
      assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/tar/test/test_option_xattrs.c"
                          ,L'-',pvVar2,"readval","testval","testval",local_38,"size",(void *)0x0);
    }
    free(pvVar2);
    assertion_make_dir("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/tar/test/test_option_xattrs.c"
                       ,L'1',"xattrs_noxattrs",L'ǭ');
    wVar1 = systemf("%s -x -C xattrs_noxattrs -p --no-xattrs -f xattrs.tar >xattrs_noxattrs.out 2>xattrs_noxattrs.err"
                    ,testprog);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/tar/test/test_option_xattrs.c"
                        ,L'3',(long)wVar1,"r",0,"0",(void *)0x0);
    pvVar2 = getXattr("xattrs_noxattrs/f","user.libarchive.test",&local_38);
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/tar/test/test_option_xattrs.c"
                     ,L'5',(uint)(pvVar2 == (void *)0x0),"readval == NULL",(void *)0x0);
    assertion_make_dir("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/tar/test/test_option_xattrs.c"
                       ,L'8',"noxattrs_xattrs",L'ǭ');
    wVar1 = systemf("%s -x -C noxattrs_xattrs --no-same-permissions --xattrs -f noxattrs.tar >noxattrs_xattrs.out 2>noxattrs_xattrs.err"
                    ,testprog);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/tar/test/test_option_xattrs.c"
                        ,L':',(long)wVar1,"r",0,"0",(void *)0x0);
    pvVar2 = getXattr("noxattrs_xattrs/f","user.libarchive.test",&local_38);
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/tar/test/test_option_xattrs.c"
                     ,L'<',(uint)(pvVar2 == (void *)0x0),"readval == NULL",(void *)0x0);
    assertion_make_dir("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/tar/test/test_option_xattrs.c"
                       ,L'?',"noxattrs_noxattrs",L'ǭ');
    wVar1 = systemf("%s -x -C noxattrs_noxattrs -p --no-xattrs -f noxattrs.tar >noxattrs_noxattrs.out 2>noxattrs_noxattrs.err"
                    ,testprog);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/tar/test/test_option_xattrs.c"
                        ,L'A',(long)wVar1,"r",0,"0",(void *)0x0);
    pvVar2 = getXattr("noxattrs_noxattrs/f","user.libarchive.test",&local_38);
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/tar/test/test_option_xattrs.c"
                     ,L'C',(uint)(pvVar2 == (void *)0x0),"readval == NULL",(void *)0x0);
    return;
  }
  skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/tar/test/test_option_xattrs.c"
                 ,L'\x1a');
  test_skipping("Can\'t set user extended attributes on this filesystem");
  return;
}

Assistant:

DEFINE_TEST(test_option_xattrs)
{
#if !ARCHIVE_XATTR_SUPPORT
        skipping("Extended attributes are not supported on this platform");
#else	/* ARCHIVE_XATTR_SUPPORT */

	const char *testattr = "user.libarchive.test";
	const char *testval = "testval";
	void *readval;
	size_t size;
	int r;

	/* Create a file. */
	assertMakeFile("f", 0644, "a");

	if (!setXattr("f", "user.libarchive.test", testval,
	    strlen(testval) + 1)) {
		skipping("Can't set user extended attributes on this "
		    "filesystem");
		return;
	}

	/* Archive with xattrs */
	r = systemf("%s -c --no-mac-metadata --xattrs -f xattrs.tar f >xattrs.out 2>xattrs.err", testprog);
	assertEqualInt(r, 0);

	/* Archive without xattrs */
	r = systemf("%s -c --no-mac-metadata --no-xattrs -f noxattrs.tar f >noxattrs.out 2>noxattrs.err", testprog);
	assertEqualInt(r, 0);

	/* Extract xattrs with xattrs */
	assertMakeDir("xattrs_xattrs", 0755);
	r = systemf("%s -x -C xattrs_xattrs --no-same-permissions --xattrs -f xattrs.tar >xattrs_xattrs.out 2>xattrs_xattrs.err", testprog);
	assertEqualInt(r, 0);
	readval = getXattr("xattrs_xattrs/f", testattr, &size);
	if(assertEqualInt(size, strlen(testval) + 1) != 0)
		assertEqualMem(readval, testval, size);
	free(readval);

	/* Extract xattrs without xattrs */
	assertMakeDir("xattrs_noxattrs", 0755);
	r = systemf("%s -x -C xattrs_noxattrs -p --no-xattrs -f xattrs.tar >xattrs_noxattrs.out 2>xattrs_noxattrs.err", testprog);
	assertEqualInt(r, 0);
	readval = getXattr("xattrs_noxattrs/f", testattr, &size);
	assert(readval == NULL);

	/* Extract noxattrs with xattrs */
	assertMakeDir("noxattrs_xattrs", 0755);
	r = systemf("%s -x -C noxattrs_xattrs --no-same-permissions --xattrs -f noxattrs.tar >noxattrs_xattrs.out 2>noxattrs_xattrs.err", testprog);
	assertEqualInt(r, 0);
	readval = getXattr("noxattrs_xattrs/f", testattr, &size);
	assert(readval == NULL);

	/* Extract noxattrs with noxattrs */
	assertMakeDir("noxattrs_noxattrs", 0755);
	r = systemf("%s -x -C noxattrs_noxattrs -p --no-xattrs -f noxattrs.tar >noxattrs_noxattrs.out 2>noxattrs_noxattrs.err", testprog);
	assertEqualInt(r, 0);
	readval = getXattr("noxattrs_noxattrs/f", testattr, &size);
	assert(readval == NULL);
#endif	/* ARCHIVE_XATTR_SUPPORT */
}